

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_client.c
# Opt level: O3

nng_err nni_http_client_init(nni_http_client **cp,nng_url *url)

{
  uint uVar1;
  char *__s;
  uint16_t uVar2;
  nng_err nVar3;
  size_t sVar4;
  nni_http_client *c;
  char *pcVar5;
  undefined1 local_f8 [8];
  nng_url my_url;
  
  local_f8 = (undefined1  [8])nni_http_stream_scheme(url->u_scheme);
  nVar3 = NNG_EADDRINVAL;
  if (local_f8 != (undefined1  [8])0x0) {
    memcpy(local_f8,url,200);
    sVar4 = strlen(url->u_hostname);
    if (0xffffffffffffff02 < sVar4 - 0xfe) {
      c = (nni_http_client *)nni_zalloc(800);
      if (c == (nni_http_client *)0x0) {
        nVar3 = NNG_ENOMEM;
      }
      else {
        nni_mtx_init(&c->mtx);
        nni_aio_list_init((nni_list *)c);
        nni_aio_init(&c->aio,http_dial_cb,c);
        uVar2 = nni_url_default_port(url->u_scheme);
        uVar1 = url->u_port;
        if (uVar1 == uVar2) {
          snprintf(c->host,0x104,"%s",url->u_hostname);
        }
        else {
          __s = url->u_hostname;
          pcVar5 = strchr(__s,0x3a);
          if (pcVar5 == (char *)0x0) {
            pcVar5 = "%s:%d";
          }
          else {
            pcVar5 = "[%s]:%d";
          }
          snprintf(c->host,0x104,pcVar5,__s,(ulong)uVar1);
        }
        nVar3 = nng_stream_dialer_alloc_url(&c->dialer,(nng_url *)local_f8);
        if (nVar3 == NNG_OK) {
          *cp = c;
          nVar3 = NNG_OK;
        }
        else {
          nni_http_client_fini(c);
        }
      }
    }
  }
  return nVar3;
}

Assistant:

nng_err
nni_http_client_init(nni_http_client **cp, const nng_url *url)
{
	nng_err          rv;
	nni_http_client *c;
	nng_url          my_url;
	const char      *scheme;

	if ((scheme = nni_http_stream_scheme(url->u_scheme)) == NULL) {
		return (NNG_EADDRINVAL);
	}
	// Rewrite URLs to either TLS or TCP.
	memcpy(&my_url, url, sizeof(my_url));
	my_url.u_scheme = (char *) scheme;

	if ((strlen(url->u_hostname) == 0) ||
	    (strlen(url->u_hostname) > 253)) {
		// We require a valid hostname.
		return (NNG_EADDRINVAL);
	}

	if ((c = NNI_ALLOC_STRUCT(c)) == NULL) {
		return (NNG_ENOMEM);
	}
	nni_mtx_init(&c->mtx);
	nni_aio_list_init(&c->aios);
	nni_aio_init(&c->aio, http_dial_cb, c);

	if (nni_url_default_port(url->u_scheme) == url->u_port) {
		snprintf(c->host, sizeof(c->host), "%s", url->u_hostname);
	} else if (strchr(url->u_hostname, ':') != NULL) {
		// IPv6 address, needs [wrapping]
		snprintf(c->host, sizeof(c->host), "[%s]:%d", url->u_hostname,
		    url->u_port);
	} else {
		snprintf(c->host, sizeof(c->host), "%s:%d", url->u_hostname,
		    url->u_port);
	}
	if ((rv = nng_stream_dialer_alloc_url(&c->dialer, &my_url)) != 0) {
		nni_http_client_fini(c);
		return (rv);
	}

	*cp = c;
	return (NNG_OK);
}